

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoSystem.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::CryptoSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,CryptoSystem *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  CryptoSystem *local_18;
  CryptoSystem *this_local;
  
  local_18 = this;
  this_local = (CryptoSystem *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Crypto System:");
  poVar1 = std::operator<<(poVar1,"\n\tEquipment:   ");
  ENUMS::GetEnumAsStringCryptoSystemType_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui16CryptoSystemType,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tMode:        ");
  ENUMS::GetEnumAsStringEncryptionMode_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)((this->field_1).m_ui16CryptoKey & 1),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tKey:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->field_1).m_ui16CryptoKey >> 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString CryptoSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Crypto System:"
       << "\n\tEquipment:   " << GetEnumAsStringCryptoSystemType( m_ui16CryptoSystemType )
       << "\n\tMode:        " << GetEnumAsStringEncryptionMode( m_ui16EncryptionMode )
       << "\n\tKey:         " << m_ui16KeyID
       << "\n";

    return ss.str();
}